

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Dsd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    do {
      iVar1 = Extra_UtilGetopt(argc,argv,"lvh");
    } while (iVar1 == 0x6c);
    if (iVar1 == -1) break;
    if (iVar1 != 0x76) {
      iVar1 = -2;
      Abc_Print(-2,"usage: &dsd [-vh]\n");
      Abc_Print(-2,"\t         performs DSD-based collapsing\n");
      pcVar2 = "yes";
      if (fVerbose == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "\t-h     : print the command usage\n";
LAB_0024c488:
      Abc_Print(iVar1,pcVar2);
      return 1;
    }
    fVerbose = fVerbose ^ 1;
  }
  if (pAbc->pGia != (Gia_Man_t *)0x0) {
    pNew = Gia_ManCollapseTest(pAbc->pGia,fVerbose);
    Abc_FrameUpdateGia(pAbc,pNew);
    return 0;
  }
  pcVar2 = "Abc_CommandAbc9Dsd(): There is no AIG.\n";
  iVar1 = -1;
  goto LAB_0024c488;
}

Assistant:

int Abc_CommandAbc9Dsd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManCollapseTest( Gia_Man_t * p, int fVerbose );
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int fUpdateLevel = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dsd(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManCollapseTest( pAbc->pGia, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dsd [-vh]\n" );
    Abc_Print( -2, "\t         performs DSD-based collapsing\n" );
//    Abc_Print( -2, "\t-l     : toggle level update during rewriting [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}